

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::CodedStreamTest_NegativeLimit_Test::TestBody
          (CodedStreamTest_NegativeLimit_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_b8;
  Message local_b0;
  int local_a8 [2];
  undefined1 local_a0 [8];
  AssertionResult gtest_ar;
  Limit limit;
  undefined1 local_80 [8];
  CodedInputStream coded_input;
  ArrayInputStream input;
  CodedStreamTest_NegativeLimit_Test *this_local;
  
  ArrayInputStream::ArrayInputStream
            ((ArrayInputStream *)&coded_input.extension_factory_,
             &io::(anonymous_namespace)::CodedStreamTest::buffer_,0x10000,-1);
  CodedInputStream::CodedInputStream
            ((CodedInputStream *)local_80,(ZeroCopyInputStream *)&coded_input.extension_factory_);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = CodedInputStream::PushLimit((CodedInputStream *)local_80,-0x4d2);
  local_a8[1] = 0xffffffff;
  local_a8[0] = CodedInputStream::BytesUntilLimit((CodedInputStream *)local_80);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_a0,"-1","coded_input.BytesUntilLimit()",local_a8 + 1,local_a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x589,message);
    testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  CodedInputStream::PopLimit
            ((CodedInputStream *)local_80,
             (Limit)gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl);
  CodedInputStream::~CodedInputStream((CodedInputStream *)local_80);
  ArrayInputStream::~ArrayInputStream((ArrayInputStream *)&coded_input.extension_factory_);
  return;
}

Assistant:

TEST_F(CodedStreamTest, NegativeLimit) {
  // Check what happens when we push a negative limit.
  ArrayInputStream input(buffer_, sizeof(buffer_));
  CodedInputStream coded_input(&input);

  CodedInputStream::Limit limit = coded_input.PushLimit(-1234);
  // BytesUntilLimit() returns -1 to mean "no limit", which actually means
  // "the limit is INT_MAX relative to the beginning of the stream".
  EXPECT_EQ(-1, coded_input.BytesUntilLimit());
  coded_input.PopLimit(limit);
}